

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O1

int __thiscall
zmq::socket_base_t::monitor
          (socket_base_t *this,char *endpoint_,uint64_t events_,int event_version_,int type_)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  ctx_t *ctx_;
  void *s_;
  scoped_lock_t lock;
  string protocol;
  string address;
  int linger;
  scoped_lock_t local_80;
  string local_78;
  string local_58;
  undefined4 local_34;
  
  scoped_lock_t::scoped_lock_t(&local_80,&this->_monitor_sync);
  if (this->_ctx_terminated == true) {
    piVar3 = __errno_location();
    *piVar3 = 0x9523dfd;
  }
  else {
    if (events_ < 0x10000 || event_version_ != 1) {
      if (endpoint_ == (char *)0x0) {
        iVar2 = 0;
        stop_monitor(this,true);
      }
      else {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        local_78._M_string_length = 0;
        local_78.field_2._M_local_buf[0] = '\0';
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
        iVar1 = parse_uri(endpoint_,&local_78,&local_58);
        iVar2 = -1;
        if (iVar1 == 0) {
          iVar1 = check_protocol(this,&local_78);
          if (iVar1 == 0) {
            iVar1 = std::__cxx11::string::compare((char *)&local_78);
            if (iVar1 == 0) {
              if (this->_monitor_socket != (void *)0x0) {
                stop_monitor(this,true);
              }
              if (((uint)type_ < 9) && ((0x103U >> (type_ & 0x1fU) & 1) != 0)) {
                this->_monitor_events = events_;
                (this->super_own_t).options.monitor_event_version = event_version_;
                ctx_ = object_t::get_ctx((object_t *)this);
                s_ = zmq_socket(ctx_,type_);
                this->_monitor_socket = s_;
                if (s_ != (void *)0x0) {
                  local_34 = 0;
                  iVar2 = zmq_setsockopt(s_,0x11,&local_34,4);
                  if (iVar2 == -1) {
                    stop_monitor(this,false);
                  }
                  iVar2 = zmq_bind(this->_monitor_socket,endpoint_);
                  if (iVar2 == -1) {
                    stop_monitor(this,false);
                  }
                }
              }
              else {
                piVar3 = __errno_location();
                *piVar3 = 0x16;
              }
            }
            else {
              piVar3 = __errno_location();
              *piVar3 = 0x5d;
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,
                          CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                   local_58.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,
                          CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                   local_78.field_2._M_local_buf[0]) + 1);
        }
      }
      goto LAB_001e169c;
    }
    piVar3 = __errno_location();
    *piVar3 = 0x16;
  }
  iVar2 = -1;
LAB_001e169c:
  scoped_lock_t::~scoped_lock_t(&local_80);
  return iVar2;
}

Assistant:

int zmq::socket_base_t::monitor (const char *endpoint_,
                                 uint64_t events_,
                                 int event_version_,
                                 int type_)
{
    scoped_lock_t lock (_monitor_sync);

    if (unlikely (_ctx_terminated)) {
        errno = ETERM;
        return -1;
    }

    //  Event version 1 supports only first 16 events.
    if (unlikely (event_version_ == 1 && events_ >> 16 != 0)) {
        errno = EINVAL;
        return -1;
    }

    //  Support deregistering monitoring endpoints as well
    if (endpoint_ == NULL) {
        stop_monitor ();
        return 0;
    }
    //  Parse endpoint_uri_ string.
    std::string protocol;
    std::string address;
    if (parse_uri (endpoint_, protocol, address) || check_protocol (protocol))
        return -1;

    //  Event notification only supported over inproc://
    if (protocol != protocol_name::inproc) {
        errno = EPROTONOSUPPORT;
        return -1;
    }

    // already monitoring. Stop previous monitor before starting new one.
    if (_monitor_socket != NULL) {
        stop_monitor (true);
    }

    // Check if the specified socket type is supported. It must be a
    // one-way socket types that support the SNDMORE flag.
    switch (type_) {
        case ZMQ_PAIR:
            break;
        case ZMQ_PUB:
            break;
        case ZMQ_PUSH:
            break;
        default:
            errno = EINVAL;
            return -1;
    }

    //  Register events to monitor
    _monitor_events = events_;
    options.monitor_event_version = event_version_;
    //  Create a monitor socket of the specified type.
    _monitor_socket = zmq_socket (get_ctx (), type_);
    if (_monitor_socket == NULL)
        return -1;

    //  Never block context termination on pending event messages
    int linger = 0;
    int rc =
      zmq_setsockopt (_monitor_socket, ZMQ_LINGER, &linger, sizeof (linger));
    if (rc == -1)
        stop_monitor (false);

    //  Spawn the monitor socket endpoint
    rc = zmq_bind (_monitor_socket, endpoint_);
    if (rc == -1)
        stop_monitor (false);
    return rc;
}